

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void __thiscall Imf_2_5::Header::sanityCheck(Header *this,bool isTiled,bool isMultipartFile)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ArgExc *pAVar4;
  ostream *poVar5;
  int *piVar6;
  float *pfVar7;
  string *psVar8;
  LineOrder *pLVar9;
  Compression *pCVar10;
  Channel *pCVar11;
  char *pcVar12;
  byte in_DL;
  byte in_SIL;
  stringstream _iex_throw_s_14;
  stringstream _iex_throw_s_13;
  stringstream _iex_throw_s_12;
  stringstream _iex_throw_s_11;
  stringstream _iex_throw_s_10;
  stringstream _iex_throw_s_9;
  stringstream _iex_throw_s_8;
  ConstIterator i_1;
  stringstream _iex_throw_s_7;
  stringstream _iex_throw_s_6;
  stringstream _iex_throw_s_5;
  ConstIterator i;
  ChannelList *channels;
  stringstream _iex_throw_s_4;
  stringstream _iex_throw_s_3;
  TileDescription *tileDesc;
  LineOrder lineOrder;
  bool isDeep;
  string *part_type;
  float screenWindowWidth;
  float MAX_PIXEL_ASPECT_RATIO;
  float MIN_PIXEL_ASPECT_RATIO;
  float pixelAspectRatio;
  stringstream _iex_throw_s_2;
  stringstream _iex_throw_s_1;
  int h;
  stringstream _iex_throw_s;
  int w;
  Box2i *dataWindow;
  Box2i *displayWindow;
  ChannelList *in_stack_ffffffffffffe518;
  string *in_stack_ffffffffffffe520;
  allocator<char> *in_stack_ffffffffffffe550;
  char *in_stack_ffffffffffffe558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe560;
  Header *in_stack_ffffffffffffe5e0;
  stringstream local_17a8 [16];
  ostream local_1798 [376];
  stringstream local_1620 [16];
  ostream local_1610 [376];
  stringstream local_1498 [16];
  ostream local_1488 [376];
  stringstream local_1310 [16];
  ostream local_1300 [376];
  stringstream local_1188 [16];
  ostream local_1178 [376];
  stringstream local_1000 [16];
  ostream local_ff0 [376];
  stringstream local_e78 [16];
  ostream local_e68 [376];
  const_iterator local_cf0;
  const_iterator local_ce8;
  stringstream local_ce0 [16];
  ostream local_cd0 [376];
  stringstream local_b58 [16];
  ostream local_b48 [376];
  stringstream local_9d0 [16];
  ostream local_9c0 [376];
  const_iterator local_848;
  const_iterator local_840;
  ChannelList *local_838;
  stringstream local_830 [16];
  ostream local_820 [376];
  stringstream local_6a8 [16];
  ostream local_698 [376];
  TileDescription *local_520;
  LineOrder local_518;
  byte local_511;
  undefined4 local_510;
  byte local_50a;
  allocator<char> local_509;
  string local_508 [32];
  string *local_4e8;
  float local_4e0;
  undefined4 local_4dc;
  undefined4 local_4d8;
  float local_4d4;
  stringstream local_4d0 [16];
  ostream local_4c0 [376];
  stringstream local_348 [16];
  ostream local_338 [376];
  int local_1c0;
  stringstream local_1b0 [16];
  ostream local_1a0 [380];
  int local_24;
  Box2i *local_20;
  Box2i *local_18;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_18 = Header::displayWindow((Header *)0x85c03c);
  if (((((local_18->max).x < (local_18->min).x) || ((local_18->max).y < (local_18->min).y)) ||
      ((local_18->min).x < -0x3ffffffe)) ||
     ((((local_18->min).y < -0x3ffffffe || (0x3ffffffe < (local_18->max).x)) ||
      (0x3ffffffe < (local_18->max).y)))) {
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar4,"Invalid display window in image header.");
    __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  local_20 = Header::dataWindow((Header *)0x85c0ff);
  if ((((local_20->max).x < (local_20->min).x) || ((local_20->max).y < (local_20->min).y)) ||
     (((local_20->min).x < -0x3ffffffe ||
      ((((local_20->min).y < -0x3ffffffe || (0x3ffffffe < (local_20->max).x)) ||
       (0x3ffffffe < (local_20->max).y)))))) {
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar4,"Invalid data window in image header.");
    __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  local_24 = ((local_20->max).x - (local_20->min).x) + 1;
  if ((0 < (anonymous_namespace)::maxImageWidth) &&
     ((anonymous_namespace)::maxImageWidth < local_24)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar5 = std::operator<<(local_1a0,"The width of the data window exceeds the maximum width of ")
    ;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(anonymous_namespace)::maxImageWidth);
    std::operator<<(poVar5,"pixels.");
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar4,local_1b0);
    __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  local_1c0 = ((local_20->max).y - (local_20->min).y) + 1;
  if ((0 < (anonymous_namespace)::maxImageHeight) &&
     ((anonymous_namespace)::maxImageHeight < local_1c0)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_348);
    poVar5 = std::operator<<(local_338,
                             "The height of the data window exceeds the maximum height of ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(anonymous_namespace)::maxImageHeight);
    std::operator<<(poVar5,"pixels.");
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar4,local_348);
    __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  if ((((0 < (anonymous_namespace)::maxImageHeight) && (0 < (anonymous_namespace)::maxImageWidth))
      && (bVar3 = hasChunkCount((Header *)0x85c3f5), bVar3)) &&
     (piVar6 = chunkCount((Header *)0x85c40b),
     (ulong)((long)(anonymous_namespace)::maxImageWidth *
            (long)(anonymous_namespace)::maxImageHeight) < (ulong)(long)*piVar6)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_4d0);
    poVar5 = std::operator<<(local_4c0,"chunkCount exceeds maximum area of ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,(long)(anonymous_namespace)::maxImageWidth *
                               (long)(anonymous_namespace)::maxImageHeight);
    std::operator<<(poVar5," pixels.");
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar4,local_4d0);
    __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pfVar7 = Header::pixelAspectRatio((Header *)0x85c50f);
  local_4d4 = *pfVar7;
  local_4d8 = 0x358637bd;
  local_4dc = 0x49742400;
  bVar3 = std::isnormal(local_4d4);
  if (((!bVar3) || (local_4d4 < 1e-06)) || (1e+06 < local_4d4)) {
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar4,"Invalid pixel aspect ratio in image header.");
    __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pfVar7 = Header::screenWindowWidth((Header *)0x85c5c3);
  local_4e0 = *pfVar7;
  if (local_4e0 < 0.0) {
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar4,"Invalid screen window width in image header.");
    __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  if ((local_a & 1) != 0) {
    bVar3 = hasName((Header *)0x85c634);
    if (!bVar3) {
      pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar4,"Headers in a multipart file should have name attribute.");
      __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    bVar3 = hasType((Header *)0x85c681);
    if (!bVar3) {
      pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar4,"Headers in a multipart file should have type attribute.");
      __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
  }
  bVar3 = hasType((Header *)0x85c6d0);
  local_50a = 0;
  if (bVar3) {
    psVar8 = type_abi_cxx11_((Header *)0x85c6eb);
    std::__cxx11::string::string(local_508,(string *)psVar8);
  }
  else {
    std::allocator<char>::allocator();
    local_50a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe550);
  }
  if ((local_50a & 1) != 0) {
    std::allocator<char>::~allocator(&local_509);
  }
  local_4e8 = local_508;
  bVar3 = std::operator!=(in_stack_ffffffffffffe520,(char *)in_stack_ffffffffffffe518);
  if ((!bVar3) || (bVar3 = isSupportedType(in_stack_ffffffffffffe520), bVar3)) {
    local_511 = isDeepData(in_stack_ffffffffffffe520);
    pLVar9 = Header::lineOrder((Header *)0x85c83e);
    local_518 = *pLVar9;
    if ((local_9 & 1) == 0) {
      if ((local_518 != INCREASING_Y) && (local_518 != DECREASING_Y)) {
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar4,"Invalid line order in image header.");
        __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
    }
    else {
      bVar3 = hasTileDescription((Header *)0x85c874);
      if (!bVar3) {
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar4,"Tiled image has no tile description attribute.");
        __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      local_520 = tileDescription((Header *)0x85c8d8);
      if ((((local_520->xSize == 0) || (local_520->ySize == 0)) || (0x7fffffff < local_520->xSize))
         || (0x7fffffff < local_520->ySize)) {
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar4,"Invalid tile size in image header.");
        __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      if ((0 < (anonymous_namespace)::maxTileWidth) &&
         ((anonymous_namespace)::maxTileWidth < (int)local_520->xSize)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_6a8);
        poVar5 = std::operator<<(local_698,"The width of the tiles exceeds the maximum width of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(anonymous_namespace)::maxTileWidth);
        std::operator<<(poVar5,"pixels.");
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar4,local_6a8);
        __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      if ((0 < (anonymous_namespace)::maxTileHeight) &&
         ((anonymous_namespace)::maxTileHeight < (int)local_520->ySize)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_830);
        poVar5 = std::operator<<(local_820,"The width of the tiles exceeds the maximum width of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(anonymous_namespace)::maxTileHeight);
        std::operator<<(poVar5,"pixels.");
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar4,local_830);
        __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      if (((local_520->mode != ONE_LEVEL) && (local_520->mode != MIPMAP_LEVELS)) &&
         (local_520->mode != RIPMAP_LEVELS)) {
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar4,"Invalid level mode in image header.");
        __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      if ((local_520->roundingMode != ROUND_UP) && (local_520->roundingMode != ROUND_DOWN)) {
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar4,"Invalid level rounding mode in image header.");
        __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      if (((local_518 != INCREASING_Y) && (local_518 != DECREASING_Y)) && (local_518 != RANDOM_Y)) {
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar4,"Invalid line order in image header.");
        __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      getTiledChunkOffsetTableSize(in_stack_ffffffffffffe5e0);
    }
    pCVar10 = compression((Header *)0x85ccf4);
    bVar3 = isValidCompression(*pCVar10);
    if (!bVar3) {
      pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar4,"Unknown compression type in image header.");
      __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    if ((local_511 & 1) != 0) {
      pCVar10 = compression((Header *)0x85cd7b);
      bVar3 = isValidDeepCompression(*pCVar10);
      if (!bVar3) {
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar4,"Compression type in header not valid for deep data");
        __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
    }
    local_838 = Header::channels((Header *)0x85cdfa);
    if (((local_9 & 1) == 0) && ((local_511 & 1) == 0)) {
      local_ce8._M_node = (_Base_ptr)ChannelList::begin(in_stack_ffffffffffffe518);
      while( true ) {
        local_cf0._M_node = (_Base_ptr)ChannelList::end(in_stack_ffffffffffffe518);
        bVar3 = Imf_2_5::operator!=((ConstIterator *)in_stack_ffffffffffffe520,
                                    (ConstIterator *)in_stack_ffffffffffffe518);
        if (!bVar3) break;
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x85d2d4);
        if (((pCVar11->type != UINT) &&
            (pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x85d2fc),
            pCVar11->type != HALF)) &&
           (pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x85d324),
           pCVar11->type != FLOAT)) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_e78);
          poVar5 = std::operator<<(local_e68,"Pixel type of \"");
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x85d382);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" image channel is invalid.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar4,local_e78);
          __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x85d436);
        if (pCVar11->xSampling < 1) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1000);
          poVar5 = std::operator<<(local_ff0,"The x subsampling factor for the \"");
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x85d495);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel is invalid.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar4,local_1000);
          __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x85d549);
        if (pCVar11->ySampling < 1) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1188);
          poVar5 = std::operator<<(local_1178,"The y subsampling factor for the \"");
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x85d5a8);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel is invalid.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar4,local_1188);
          __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        iVar1 = (local_20->min).x;
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x85d66d);
        if (iVar1 % pCVar11->xSampling != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1310);
          poVar5 = std::operator<<(local_1300,
                                   "The minimum x coordinate of the image\'s data window is not a multiple of the x subsampling factor of the \""
                                  );
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x85d6d6);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar4,local_1310);
          __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        iVar1 = (local_20->min).y;
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x85d79c);
        if (iVar1 % pCVar11->ySampling != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1498);
          poVar5 = std::operator<<(local_1488,
                                   "The minimum y coordinate of the image\'s data window is not a multiple of the y subsampling factor of the \""
                                  );
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x85d802);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar4,local_1498);
          __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        iVar1 = (local_20->min).x;
        iVar2 = (local_20->max).x;
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x85d8b6);
        if (((iVar2 - iVar1) + 1) % pCVar11->xSampling != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1620);
          poVar5 = std::operator<<(local_1610,
                                   "Number of pixels per row in the image\'s data window is not a multiple of the x subsampling factor of the \""
                                  );
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x85d913);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar4,local_1620);
          __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        iVar1 = (local_20->min).y;
        iVar2 = (local_20->max).y;
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x85d9c8);
        if (((iVar2 - iVar1) + 1) % pCVar11->ySampling != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_17a8);
          poVar5 = std::operator<<(local_1798,
                                   "Number of pixels per column in the image\'s data window is not a multiple of the y subsampling factor of the \""
                                  );
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x85da25);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar4,local_17a8);
          __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_ffffffffffffe520);
      }
    }
    else {
      local_840._M_node = (_Base_ptr)ChannelList::begin(in_stack_ffffffffffffe518);
      while( true ) {
        local_848._M_node = (_Base_ptr)ChannelList::end(in_stack_ffffffffffffe518);
        bVar3 = Imf_2_5::operator!=((ConstIterator *)in_stack_ffffffffffffe520,
                                    (ConstIterator *)in_stack_ffffffffffffe518);
        if (!bVar3) break;
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x85ceb5);
        if (((pCVar11->type != UINT) &&
            (pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x85cedd),
            pCVar11->type != HALF)) &&
           (pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x85cf05),
           pCVar11->type != FLOAT)) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_9d0);
          poVar5 = std::operator<<(local_9c0,"Pixel type of \"");
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x85cf63);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" image channel is invalid.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar4,local_9d0);
          __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x85d017);
        if (pCVar11->xSampling != 1) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_b58);
          poVar5 = std::operator<<(local_b48,"The x subsampling factor for the \"");
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x85d076);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel is not 1.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar4,local_b58);
          __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        pCVar11 = ChannelList::ConstIterator::channel((ConstIterator *)0x85d12a);
        if (pCVar11->ySampling != 1) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_ce0);
          poVar5 = std::operator<<(local_cd0,"The y subsampling factor for the \"");
          pcVar12 = ChannelList::ConstIterator::name((ConstIterator *)0x85d189);
          poVar5 = std::operator<<(poVar5,pcVar12);
          std::operator<<(poVar5,"\" channel is not 1.");
          pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar4,local_ce0);
          __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_ffffffffffffe520);
      }
    }
    local_510 = 0;
  }
  else {
    local_510 = 1;
  }
  std::__cxx11::string::~string(local_508);
  return;
}

Assistant:

void		
Header::sanityCheck (bool isTiled, bool isMultipartFile) const
{
    //
    // The display window and the data window must each
    // contain at least one pixel.  In addition, the
    // coordinates of the window corners must be small
    // enough to keep expressions like max-min+1 or
    // max+min from overflowing.
    //

    const Box2i &displayWindow = this->displayWindow();

    if (displayWindow.min.x > displayWindow.max.x ||
	displayWindow.min.y > displayWindow.max.y ||
	displayWindow.min.x <= -(INT_MAX / 2) ||
	displayWindow.min.y <= -(INT_MAX / 2) ||
	displayWindow.max.x >=  (INT_MAX / 2) ||
	displayWindow.max.y >=  (INT_MAX / 2))
    {
	throw IEX_NAMESPACE::ArgExc ("Invalid display window in image header.");
    }

    const Box2i &dataWindow = this->dataWindow();

    if (dataWindow.min.x > dataWindow.max.x ||
	dataWindow.min.y > dataWindow.max.y ||
	dataWindow.min.x <= -(INT_MAX / 2) ||
	dataWindow.min.y <= -(INT_MAX / 2) ||
	dataWindow.max.x >=  (INT_MAX / 2) ||
	dataWindow.max.y >=  (INT_MAX / 2))
    {
	throw IEX_NAMESPACE::ArgExc ("Invalid data window in image header.");
    }

    int w = (dataWindow.max.x - dataWindow.min.x + 1);
    if (maxImageWidth > 0 && maxImageWidth < w)
    {
	THROW (IEX_NAMESPACE::ArgExc, "The width of the data window exceeds the "
			    "maximum width of " << maxImageWidth << "pixels.");
    }

    int h = (dataWindow.max.y - dataWindow.min.y + 1);
    if (maxImageHeight > 0 && maxImageHeight < h)
    {
	THROW (IEX_NAMESPACE::ArgExc, "The height of the data window exceeds the "
			    "maximum height of " << maxImageHeight << "pixels.");
    }

    // chunk table must be smaller than the maximum image area
    // (only reachable for unknown types or damaged files: will have thrown earlier
    //  for regular image types)
    if( maxImageHeight>0 && maxImageWidth>0 && 
	hasChunkCount() && static_cast<Int64>(chunkCount())>Int64(maxImageWidth)*Int64(maxImageHeight))
    {
	THROW (IEX_NAMESPACE::ArgExc, "chunkCount exceeds maximum area of "
	       << Int64(maxImageWidth)*Int64(maxImageHeight) << " pixels." );
       
    }


    //
    // The pixel aspect ratio must be greater than 0.
    // In applications, numbers like the the display or
    // data window dimensions are likely to be multiplied
    // or divided by the pixel aspect ratio; to avoid
    // arithmetic exceptions, we limit the pixel aspect
    // ratio to a range that is smaller than theoretically
    // possible (real aspect ratios are likely to be close
    // to 1.0 anyway).
    //

    float pixelAspectRatio = this->pixelAspectRatio();

    const float MIN_PIXEL_ASPECT_RATIO = 1e-6f;
    const float MAX_PIXEL_ASPECT_RATIO = 1e+6f;

    if (!std::isnormal(pixelAspectRatio) ||
        pixelAspectRatio < MIN_PIXEL_ASPECT_RATIO ||
        pixelAspectRatio > MAX_PIXEL_ASPECT_RATIO)
    {
        throw IEX_NAMESPACE::ArgExc ("Invalid pixel aspect ratio in image header.");
    }

    //
    // The screen window width must not be less than 0.
    // The size of the screen window can vary over a wide
    // range (fish-eye lens to astronomical telescope),
    // so we can't limit the screen window width to a
    // small range.
    //

    float screenWindowWidth = this->screenWindowWidth();

    if (screenWindowWidth < 0)
	throw IEX_NAMESPACE::ArgExc ("Invalid screen window width in image header.");

    //
    // If the file has multiple parts, verify that each header has attribute
    // name and type.
    // (TODO) We may want to check more stuff here.
    //

    if (isMultipartFile)
    {
        if (!hasName())
        {
            throw IEX_NAMESPACE::ArgExc ("Headers in a multipart file should"
                               " have name attribute.");
        }

        if (!hasType())
        {
            throw IEX_NAMESPACE::ArgExc ("Headers in a multipart file should"
                               " have type attribute.");
        }

    }
    
    const std::string & part_type=hasType() ? type() : "";

    
    if(part_type!="" && !isSupportedType(part_type))
    {
        //
        // skip remaining sanity checks with unsupported types - they may not hold
        //
        return;
    }
    
    bool isDeep = isDeepData(part_type);
   
    //
    // If the file is tiled, verify that the tile description has reasonable
    // values and check to see if the lineOrder is one of the predefined 3.
    // If the file is not tiled, then the lineOrder can only be INCREASING_Y
    // or DECREASING_Y.
    //

    LineOrder lineOrder = this->lineOrder();

    if (isTiled)
    {
        if (!hasTileDescription())
        {
            throw IEX_NAMESPACE::ArgExc ("Tiled image has no tile "
                        "description attribute.");
        }

        const TileDescription &tileDesc = tileDescription();

        if (tileDesc.xSize <= 0 || tileDesc.ySize <= 0 || tileDesc.xSize > INT_MAX || tileDesc.ySize > INT_MAX )
            throw IEX_NAMESPACE::ArgExc ("Invalid tile size in image header.");

        if (maxTileWidth > 0 &&
            maxTileWidth < int(tileDesc.xSize))
        {
            THROW (IEX_NAMESPACE::ArgExc, "The width of the tiles exceeds the maximum "
                    "width of " << maxTileWidth << "pixels.");
        }

        if (maxTileHeight > 0 &&
            maxTileHeight < int(tileDesc.ySize))
        {
            THROW (IEX_NAMESPACE::ArgExc, "The width of the tiles exceeds the maximum "
                    "width of " << maxTileHeight << "pixels.");
        }

        if (tileDesc.mode != ONE_LEVEL &&
            tileDesc.mode != MIPMAP_LEVELS &&
            tileDesc.mode != RIPMAP_LEVELS)
            throw IEX_NAMESPACE::ArgExc ("Invalid level mode in image header.");

        if (tileDesc.roundingMode != ROUND_UP &&
            tileDesc.roundingMode != ROUND_DOWN)
            throw IEX_NAMESPACE::ArgExc ("Invalid level rounding mode in image header.");

        if (lineOrder != INCREASING_Y &&
            lineOrder != DECREASING_Y &&
            lineOrder != RANDOM_Y)
            throw IEX_NAMESPACE::ArgExc ("Invalid line order in image header.");

        // computes size of chunk offset table. Throws an exception if this exceeds
        // the maximum allowable size
        getTiledChunkOffsetTableSize(*this);

    }
    else
    {
        if (lineOrder != INCREASING_Y &&
            lineOrder != DECREASING_Y)
            throw IEX_NAMESPACE::ArgExc ("Invalid line order in image header.");
        
        
    }

    //
    // The compression method must be one of the predefined values.
    //

    if (!isValidCompression (this->compression()))
  	throw IEX_NAMESPACE::ArgExc ("Unknown compression type in image header.");
    
    
    if( isDeep )
    {
        if (!isValidDeepCompression (this->compression()))
            throw IEX_NAMESPACE::ArgExc ("Compression type in header not valid for deep data");
    }

    //
    // Check the channel list:
    //
    // If the file is tiled then for each channel, the type must be one of the
    // predefined values, and the x and y sampling must both be 1.
    //
    // x and y sampling must currently also be 1 for deep scanline images
    //
    // If the file is not tiled then for each channel, the type must be one
    // of the predefined values, the x and y coordinates of the data window's
    // upper left corner must be divisible by the x and y subsampling factors,
    // and the width and height of the data window must be divisible by the
    // x and y subsampling factors.
    //

    const ChannelList &channels = this->channels();
    
    if (isTiled || isDeep)
    {
	for (ChannelList::ConstIterator i = channels.begin();
	     i != channels.end();
	     ++i)
	{
	    if (i.channel().type != OPENEXR_IMF_INTERNAL_NAMESPACE::UINT &&
		    i.channel().type != OPENEXR_IMF_INTERNAL_NAMESPACE::HALF &&
		    i.channel().type != OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "Pixel type of \"" << i.name() << "\" "
			            "image channel is invalid.");
	    }

	    if (i.channel().xSampling != 1)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "The x subsampling factor for the "
				    "\"" << i.name() << "\" channel "
				    "is not 1.");
	    }	

	    if (i.channel().ySampling != 1)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "The y subsampling factor for the "
				    "\"" << i.name() << "\" channel "
				    "is not 1.");
	    }	
	}
    }
    else
    {
	for (ChannelList::ConstIterator i = channels.begin();
	     i != channels.end();
	     ++i)
	{
	    if (i.channel().type != OPENEXR_IMF_INTERNAL_NAMESPACE::UINT &&
		    i.channel().type != OPENEXR_IMF_INTERNAL_NAMESPACE::HALF &&
		    i.channel().type != OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "Pixel type of \"" << i.name() << "\" "
			            "image channel is invalid.");
	    }

	    if (i.channel().xSampling < 1)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "The x subsampling factor for the "
				    "\"" << i.name() << "\" channel "
				    "is invalid.");
	    }

	    if (i.channel().ySampling < 1)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "The y subsampling factor for the "
				    "\"" << i.name() << "\" channel "
				    "is invalid.");
	    }

	    if (dataWindow.min.x % i.channel().xSampling)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "The minimum x coordinate of the "
				    "image's data window is not a multiple "
				    "of the x subsampling factor of "
				    "the \"" << i.name() << "\" channel.");
	    }

	    if (dataWindow.min.y % i.channel().ySampling)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "The minimum y coordinate of the "
				    "image's data window is not a multiple "
				    "of the y subsampling factor of "
				    "the \"" << i.name() << "\" channel.");
	    }

	    if ((dataWindow.max.x - dataWindow.min.x + 1) %
		    i.channel().xSampling)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "Number of pixels per row in the "
				    "image's data window is not a multiple "
				    "of the x subsampling factor of "
				    "the \"" << i.name() << "\" channel.");
	    }

	    if ((dataWindow.max.y - dataWindow.min.y + 1) %
		    i.channel().ySampling)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "Number of pixels per column in the "
				    "image's data window is not a multiple "
				    "of the y subsampling factor of "
				    "the \"" << i.name() << "\" channel.");
	    }
	}
    }
}